

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_memory.cpp
# Opt level: O3

Object * __thiscall LiteScript::_BasicMemory_1::CreateAt(_BasicMemory_1 *this,uint id)

{
  uchar *puVar1;
  Object *this_00;
  _BasicMemory_0 *p_Var2;
  long lVar3;
  Memory *mem;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  uVar4 = id >> 8;
  p_Var2 = (this->arr)._M_elems[uVar4];
  if (p_Var2 == (_BasicMemory_0 *)0x0) {
    p_Var2 = (_BasicMemory_0 *)operator_new(0x2f20);
    mem = this->memory;
    p_Var2->first_free = 0;
    p_Var2->count = 0;
    p_Var2->memory = mem;
    p_Var2->Count = &p_Var2->count;
    iVar6 = 6;
    iVar7 = 7;
    iVar8 = 4;
    iVar9 = 5;
    sVar10 = 2;
    sVar11 = 3;
    sVar12 = 0;
    sVar13 = 1;
    lVar3 = 0x1600;
    do {
      auVar14._0_4_ = (int)sVar12;
      auVar14._4_4_ = (int)sVar13;
      auVar14._8_4_ = (int)sVar10;
      auVar14._12_4_ = (int)sVar11;
      auVar15._4_4_ = iVar9 * 0x10000 >> 0x10;
      auVar15._0_4_ = iVar8 * 0x10000 >> 0x10;
      auVar15._8_4_ = iVar6 * 0x10000 >> 0x10;
      auVar15._12_4_ = iVar7 * 0x10000 >> 0x10;
      auVar15 = packssdw(auVar14,auVar15);
      puVar1 = p_Var2->arr + lVar3 * 2;
      *(short *)puVar1 = auVar15._0_2_ + 1;
      *(short *)(puVar1 + 2) = auVar15._2_2_ + 1;
      *(short *)(puVar1 + 4) = auVar15._4_2_ + 1;
      *(short *)(puVar1 + 6) = auVar15._6_2_ + 1;
      *(short *)(puVar1 + 8) = auVar15._8_2_ + 1;
      *(short *)(puVar1 + 10) = auVar15._10_2_ + 1;
      *(short *)(puVar1 + 0xc) = auVar15._12_2_ + 1;
      *(short *)(puVar1 + 0xe) = auVar15._14_2_ + 1;
      sVar12 = sVar12 + 8;
      sVar13 = sVar13 + 8;
      sVar10 = sVar10 + 8;
      sVar11 = sVar11 + 8;
      iVar8 = iVar8 + 8;
      iVar9 = iVar9 + 8;
      iVar6 = iVar6 + 8;
      iVar7 = iVar7 + 8;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x1700);
    (this->arr)._M_elems[uVar4] = p_Var2;
    (this->nfull)._M_elems[uVar4] = this->first_nfull;
    this->first_nfull = (short)(id >> 8);
  }
  else {
    mem = p_Var2->memory;
  }
  uVar5 = (ulong)id & 0xff;
  this_00 = (Object *)(p_Var2->arr + uVar5 * 0x28);
  Object::Object(this_00,mem,id);
  p_Var2->first_free = (short)uVar5;
  (p_Var2->ref_cpt)._M_elems[uVar5] = 0;
  (p_Var2->free)._M_elems[uVar5] = -1;
  p_Var2->count = p_Var2->count + 1;
  this->count = this->count + 1;
  if ((this->arr)._M_elems[uVar4]->count == 0x100) {
    lVar3 = 0;
    do {
      if (uVar4 == (int)(this->nfull)._M_elems[lVar3]) {
        (this->nfull)._M_elems[lVar3] = (this->nfull)._M_elems[uVar4];
        return this_00;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    this->first_nfull = (this->nfull)._M_elems[uVar4];
  }
  return this_00;
}

Assistant:

LiteScript::Object& LiteScript::_BasicMemory_1::CreateAt(unsigned int id) {
    unsigned int block = id >> 8;
    if (this->arr[block] == nullptr) {
        this->arr[block] = new LiteScript::_BasicMemory_0(this->memory);
        this->nfull[block] = this->first_nfull;
        this->first_nfull = (short)block;
    }
    Object& obj = this->arr[block]->CreateAt(id);
    this->count++;
    if (this->arr[block]->isFull()) {
        unsigned int j;
        for (j = 0; j < LITESCRIPT_MEMORY_1_SIZE && this->nfull[j] != block; j++);
        if (j == LITESCRIPT_MEMORY_1_SIZE)
            this->first_nfull = this->nfull[block];
        else
            this->nfull[j] = this->nfull[block];
    }
    return obj;
}